

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O0

int dwarf_get_DS_name(uint val,char **s_out)

{
  char **s_out_local;
  uint val_local;
  
  switch(val) {
  case 1:
    *s_out = "DW_DS_unsigned";
    s_out_local._4_4_ = 0;
    break;
  case 2:
    *s_out = "DW_DS_leading_overpunch";
    s_out_local._4_4_ = 0;
    break;
  case 3:
    *s_out = "DW_DS_trailing_overpunch";
    s_out_local._4_4_ = 0;
    break;
  case 4:
    *s_out = "DW_DS_leading_separate";
    s_out_local._4_4_ = 0;
    break;
  case 5:
    *s_out = "DW_DS_trailing_separate";
    s_out_local._4_4_ = 0;
    break;
  default:
    s_out_local._4_4_ = -1;
  }
  return s_out_local._4_4_;
}

Assistant:

int
dwarf_get_DS_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_DS_unsigned:
        *s_out = "DW_DS_unsigned";
        return DW_DLV_OK;
    case DW_DS_leading_overpunch:
        *s_out = "DW_DS_leading_overpunch";
        return DW_DLV_OK;
    case DW_DS_trailing_overpunch:
        *s_out = "DW_DS_trailing_overpunch";
        return DW_DLV_OK;
    case DW_DS_leading_separate:
        *s_out = "DW_DS_leading_separate";
        return DW_DLV_OK;
    case DW_DS_trailing_separate:
        *s_out = "DW_DS_trailing_separate";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}